

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O1

bool __thiscall
duckdb::StringValueScanner::IsRowValid(StringValueScanner *this,CSVIterator *current_iterator)

{
  idx_t iVar1;
  char *pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  CSVBufferHandle *pCVar6;
  unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_> this_00;
  pointer pSVar7;
  undefined4 extraout_var;
  char *pcVar9;
  bool bVar10;
  undefined1 local_41;
  templated_unique_single_t scan_finder;
  shared_ptr<duckdb::CSVErrorHandler,_true> local_38;
  CSVErrorHandler *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  long lVar8;
  
  iVar1 = (this->super_BaseScanner).iterator.pos.buffer_pos;
  pCVar6 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->
                     (&(this->super_BaseScanner).cur_buffer_handle);
  if (iVar1 == pCVar6->actual_size) {
    return false;
  }
  local_28 = (CSVErrorHandler *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::CSVErrorHandler,std::allocator<duckdb::CSVErrorHandler>>
            (&local_20,&local_28,(allocator<duckdb::CSVErrorHandler> *)&local_41);
  local_38.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_28;
  local_38.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_20._M_pi;
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
    }
  }
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  this_00._M_t.
  super___uniq_ptr_impl<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::StringValueScanner_*,_std::default_delete<duckdb::StringValueScanner>_>
  .super__Head_base<0UL,_duckdb::StringValueScanner_*,_false>._M_head_impl =
       (__uniq_ptr_data<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true,_true>
        )operator_new(0x4c8);
  StringValueScanner((StringValueScanner *)
                     this_00._M_t.
                     super___uniq_ptr_impl<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::StringValueScanner_*,_std::default_delete<duckdb::StringValueScanner>_>
                     .super__Head_base<0UL,_duckdb::StringValueScanner_*,_false>._M_head_impl,
                     0xffffffffffffffff,&(this->super_BaseScanner).buffer_manager,
                     &this->state_machine_strict,&local_38,&(this->super_BaseScanner).csv_file_scan,
                     false,current_iterator,1);
  scan_finder.
  super_unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::StringValueScanner_*,_std::default_delete<duckdb::StringValueScanner>_>
  .super__Head_base<0UL,_duckdb::StringValueScanner_*,_false>._M_head_impl =
       (unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>)
       (unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>)
       this_00._M_t.
       super___uniq_ptr_impl<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::StringValueScanner_*,_std::default_delete<duckdb::StringValueScanner>_>
       .super__Head_base<0UL,_duckdb::StringValueScanner_*,_false>._M_head_impl;
  if (local_38.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.internal.
               super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  pSVar7 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
           ::operator->(&scan_finder);
  iVar5 = (*(pSVar7->super_BaseScanner)._vptr_BaseScanner[2])(pSVar7);
  lVar8 = CONCAT44(extraout_var,iVar5);
  pSVar7 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
           ::operator->(&scan_finder);
  uVar3 = *(undefined4 *)((long)&(pSVar7->super_BaseScanner).iterator.pos.buffer_idx + 4);
  iVar1 = (pSVar7->super_BaseScanner).iterator.pos.buffer_pos;
  uVar4 = *(undefined4 *)((long)&(pSVar7->super_BaseScanner).iterator.pos.buffer_pos + 4);
  *(int *)&(current_iterator->pos).buffer_idx =
       (int)(pSVar7->super_BaseScanner).iterator.pos.buffer_idx;
  *(undefined4 *)((long)&(current_iterator->pos).buffer_idx + 4) = uVar3;
  *(int *)&(current_iterator->pos).buffer_pos = (int)iVar1;
  *(undefined4 *)((long)&(current_iterator->pos).buffer_pos + 4) = uVar4;
  pcVar9 = *(char **)(lVar8 + 0x220);
  pcVar2 = *(char **)(lVar8 + 0x228);
  bVar10 = true;
  if (pcVar9 != pcVar2) {
    if ((long)pcVar2 - (long)pcVar9 == 0x58) {
      if (*pcVar9 != '\x06') {
        do {
          pcVar9 = pcVar9 + 0x58;
          if (pcVar9 == pcVar2) goto LAB_00d26800;
        } while (*pcVar9 != '\x06');
        if (pcVar9 == pcVar2) goto LAB_00d26800;
      }
    }
    else {
LAB_00d26800:
      bVar10 = false;
    }
  }
  if (*(long *)(lVar8 + 0xf0) == 1) {
    if (bVar10) {
LAB_00d2681d:
      bVar10 = *(long *)(lVar8 + 0x358) == 0;
      goto LAB_00d26828;
    }
  }
  else if ((*(byte *)(lVar8 + 0x398) & bVar10) != 0) goto LAB_00d2681d;
  bVar10 = false;
LAB_00d26828:
  if (scan_finder.
      super_unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::StringValueScanner_*,_std::default_delete<duckdb::StringValueScanner>_>
      .super__Head_base<0UL,_duckdb::StringValueScanner_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)scan_finder.
                          super_unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::StringValueScanner_*,_std::default_delete<duckdb::StringValueScanner>_>
                          .super__Head_base<0UL,_duckdb::StringValueScanner_*,_false>._M_head_impl +
                8))();
  }
  return bVar10;
}

Assistant:

bool StringValueScanner::IsRowValid(CSVIterator &current_iterator) const {
	if (iterator.pos.buffer_pos == cur_buffer_handle->actual_size) {
		return false;
	}
	constexpr idx_t result_size = 1;
	auto scan_finder = make_uniq<StringValueScanner>(StringValueScanner::LINE_FINDER_ID, buffer_manager,
	                                                 state_machine_strict, make_shared_ptr<CSVErrorHandler>(),
	                                                 csv_file_scan, false, current_iterator, result_size);
	auto &tuples = scan_finder->ParseChunk();
	current_iterator.pos = scan_finder->GetIteratorPosition();
	bool has_error = false;
	if (tuples.current_errors.HasError()) {
		if (tuples.current_errors.Size() != 1 || !tuples.current_errors.HasErrorType(MAXIMUM_LINE_SIZE)) {
			// We ignore maximum line size errors
			has_error = true;
		}
	}
	return (tuples.number_of_rows == 1 || tuples.first_line_is_comment) && !has_error && tuples.borked_rows.empty();
}